

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perplexity.cpp
# Opt level: O0

bool decode_helper(llama_context *ctx,llama_batch *batch,
                  vector<float,_std::allocator<float>_> *batch_logits,int n_batch,int n_vocab)

{
  undefined8 uVar1;
  int *piVar2;
  long lVar3;
  common_log *log;
  float *pfVar4;
  void *__src;
  uint in_ECX;
  int *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  undefined8 in_R9;
  int i_1;
  int n_outputs;
  int ret;
  llama_batch batch_view;
  int n_tokens;
  int i;
  int prev_outputs;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined8 uVar11;
  int local_b8;
  int local_b4;
  undefined4 local_b0 [2];
  undefined4 uStack_a8;
  undefined4 local_a0;
  undefined4 uStack_98;
  undefined4 local_90;
  undefined4 uStack_88;
  undefined8 local_80;
  uint local_74;
  int local_70 [2];
  long local_68;
  undefined8 local_60;
  long local_58;
  long local_50;
  long local_48;
  int local_38;
  int iVar12;
  int iVar13;
  int iVar14;
  uint local_24 [3];
  int *local_18;
  undefined8 local_10;
  
  iVar14 = 0;
  iVar13 = 0;
  local_24[0] = in_ECX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (*local_18 <= iVar13) {
      return true;
    }
    local_38 = *local_18 - iVar13;
    piVar2 = std::min<int>((int *)local_24,&local_38);
    uVar1 = local_10;
    local_70[0] = *piVar2;
    local_68 = *(long *)(local_18 + 2) + (long)iVar13 * 4;
    local_60 = 0;
    local_58 = *(long *)(local_18 + 6) + (long)iVar13 * 4;
    local_50 = *(long *)(local_18 + 8) + (long)iVar13 * 4;
    local_48 = *(long *)(local_18 + 10) + (long)iVar13 * 8;
    lVar3 = *(long *)(local_18 + 0xc) + (long)iVar13;
    iVar12 = local_70[0];
    memcpy(local_b0,local_70,0x38);
    uVar5 = local_b0[0];
    uVar6 = uStack_a8;
    uVar7 = local_a0;
    uVar8 = uStack_98;
    uVar9 = local_90;
    uVar10 = uStack_88;
    uVar11 = local_80;
    local_74 = llama_decode(uVar1);
    if (local_74 != 0) break;
    local_b4 = 0;
    for (local_b8 = 0; local_b8 < iVar12; local_b8 = local_b8 + 1) {
      local_b4 = (uint)(*(char *)(lVar3 + local_b8) != '\0') + local_b4;
    }
    pfVar4 = std::vector<float,_std::allocator<float>_>::data
                       ((vector<float,_std::allocator<float>_> *)0x187f01);
    lVar3 = (long)iVar14;
    __src = (void *)llama_get_logits(local_10);
    memcpy(pfVar4 + lVar3 * in_R8D,__src,(long)local_b4 * (long)in_R8D * 4);
    iVar14 = local_b4 + iVar14;
    iVar13 = local_24[0] + iVar13;
  }
  if (-1 < common_log_verbosity_thold) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_ERROR,"failed to decode the batch, n_batch = %d, ret = %d\n",
                   (ulong)local_24[0],(ulong)local_74,in_R9,uVar5,uVar6,uVar7,uVar8,uVar9,uVar10,
                   uVar11);
  }
  return false;
}

Assistant:

static bool decode_helper(llama_context * ctx, llama_batch & batch, std::vector<float> & batch_logits, int n_batch, int n_vocab) {
    int prev_outputs = 0;
    for (int i = 0; i < (int) batch.n_tokens; i += n_batch) {
        const int n_tokens = std::min<int>(n_batch, batch.n_tokens - i);

        llama_batch batch_view = {
            n_tokens,
            batch.token    + i,
            nullptr,
            batch.pos      + i,
            batch.n_seq_id + i,
            batch.seq_id   + i,
            batch.logits   + i,
        };

        const int ret = llama_decode(ctx, batch_view);
        if (ret != 0) {
            LOG_ERR("failed to decode the batch, n_batch = %d, ret = %d\n", n_batch, ret);
            return false;
        }

        int n_outputs = 0;
        for (int i = 0; i < n_tokens; ++i) {
            n_outputs += batch_view.logits[i] != 0;
        }

        memcpy(batch_logits.data() + size_t(prev_outputs)*n_vocab, llama_get_logits(ctx), size_t(n_outputs)*n_vocab*sizeof(float));

        prev_outputs += n_outputs;
    }

    return true;
}